

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

field_type __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
::max_count(btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
            *this)

{
  template_ElementType<1UL> *ptVar1;
  field_type local_12;
  field_type max_cnt;
  btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_true>_>
  *this_local;
  
  ptVar1 = btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,true>>
           ::GetField<1ul>((btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,true>>
                            *)this);
  local_12 = ptVar1[3];
  if (local_12 == '\0') {
    local_12 = '\x0f';
  }
  return local_12;
}

Assistant:

field_type max_count() const {
            // Internal nodes have max_count==kInternalNodeMaxCount.
            // Leaf nodes have max_count in [1, kNodeValues].
            const field_type max_cnt = GetField<1>()[3];
            return max_cnt == field_type{kInternalNodeMaxCount}
            ? field_type{kNodeValues}
            : max_cnt;
        }